

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::localityModifiers(string *unit,uint64_t match_flags)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  pointer pcVar4;
  precise_unit pVar5;
  int iVar6;
  size_t sVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  long lVar11;
  ulong uVar12;
  uint64_t uVar13;
  undefined8 uVar14;
  bool bVar15;
  bool bVar16;
  precise_unit pVar17;
  precise_unit pVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nunit;
  double local_d0;
  string local_c0;
  ulong local_a0;
  uint64_t local_98;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  if (2 < unit->_M_string_length) {
    pcVar2 = (unit->_M_dataplus)._M_p;
    if ((*pcVar2 == 'u') && ((pcVar2[1] == 'S' || (pcVar2[1] == 'K')))) {
      *pcVar2 = 'U';
    }
    lVar11 = 8;
    local_a0 = local_a0 & 0xffffffff00000000;
    local_98 = match_flags;
    do {
      pcVar2 = *(char **)((long)&wordModifiers::modifiers._M_elems[0x26].
                                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                 .super__Head_base<0UL,_const_char_*,_false>._M_head_impl + lVar11);
      sVar7 = strlen(pcVar2);
      if (sVar7 == 2) {
        iVar6 = strncmp(pcVar2,*(char **)((long)&localityModifiers::internationlReplacements.
                                                 _M_elems[0].first + lVar11),2);
        if (iVar6 != 0) {
LAB_00181d8a:
          pcVar3 = (unit->_M_dataplus)._M_p;
          cVar1 = pcVar3[1];
          if (((('\0' < cVar1) && (iVar6 = isupper((int)cVar1), iVar6 != 0)) &&
              (iVar6 = toupper((int)*pcVar3), iVar6 == *pcVar2)) && (cVar1 == pcVar2[1])) {
            *pcVar3 = (char)iVar6;
          }
          goto LAB_00181dc1;
        }
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct((ulong)local_90,'\x01');
        plVar8 = (long *)std::__cxx11::string::append((char *)local_90);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0.field_2._8_8_ = plVar8[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar10;
          local_c0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_c0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        uVar12 = (long)unit->_M_string_length - local_c0._M_string_length;
        if ((string *)unit->_M_string_length < local_c0._M_string_length || uVar12 == 0) {
          bVar15 = false;
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((ulong)unit,uVar12,(string *)local_c0._M_string_length);
          bVar15 = iVar6 == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        iVar6 = 3;
        if (!bVar15) goto LAB_00181d8a;
      }
      else {
LAB_00181dc1:
        strlen(pcVar2);
        iVar6 = 0;
        uVar12 = std::__cxx11::string::find((char *)unit,(ulong)pcVar2,0);
        if (uVar12 != 0xffffffffffffffff) {
          sVar7 = strlen(pcVar2);
          iVar6 = 1;
          if (sVar7 != unit->_M_string_length) {
            std::__cxx11::string::erase((ulong)unit,uVar12);
            if ((uVar12 != 0) && ((unit->_M_dataplus)._M_p[uVar12 - 1] == '_')) {
              std::__cxx11::string::erase((ulong)unit,uVar12 - 1);
            }
            if ((uVar12 < unit->_M_string_length) && ((unit->_M_dataplus)._M_p[uVar12] == '_')) {
              std::__cxx11::string::erase((ulong)unit,uVar12);
            }
            std::__cxx11::string::push_back((char)unit);
            uVar14 = std::__cxx11::string::append((char *)unit);
            local_a0 = CONCAT44(local_a0._4_4_,(int)CONCAT71((int7)((ulong)uVar14 >> 8),1));
            iVar6 = 2;
          }
        }
      }
      if ((iVar6 != 3) && (iVar6 != 0)) goto LAB_00181eae;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 1000);
    iVar6 = 2;
LAB_00181eae:
    if (iVar6 == 2) {
      bVar15 = clearEmptySegments(unit);
      if ((local_a0 & 1) != 0 || bVar15) {
        pcVar4 = (unit->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + unit->_M_string_length);
        uVar13 = local_98;
        pVar17 = unit_from_string_internal(&local_50,local_98 | 0xc00000);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (((uint)uVar13 >> 0x16 & 1) != 0) {
          return pVar17;
        }
        if (!NAN(pVar17.multiplier_) && (pVar17._8_8_ & 0xffffffff) != 0xfa94a488) {
          return pVar17;
        }
        pcVar4 = (unit->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar4,pcVar4 + unit->_M_string_length);
        pVar17 = localityModifiers(&local_70,uVar13 | 0x400000);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return pVar17;
        }
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        return pVar17;
      }
      if (3 < unit->_M_string_length) {
        local_d0 = NAN;
        local_a0 = 0;
        uVar14 = 0xfa94a488;
        lVar11 = 0;
        uVar13 = local_98;
        do {
          pcVar2 = *(char **)((long)localityModifiers::rotSequences._M_elems + lVar11);
          iVar6 = std::__cxx11::string::compare((ulong)unit,0,(char *)0x2);
          if (iVar6 == 0) {
            std::__cxx11::string::substr((ulong)&local_c0,(ulong)unit);
            if ((local_c0._M_dataplus._M_p + -1)[local_c0._M_string_length] == 's') {
              std::__cxx11::string::pop_back();
            }
            std::__cxx11::string::push_back((char)&local_c0);
            std::__cxx11::string::append((char *)&local_c0);
            pVar17 = get_unit(&local_c0,uVar13);
            uVar14 = pVar17._8_8_;
            paVar9 = &local_c0.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar9) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
              paVar9 = extraout_RAX;
            }
            pVar18._8_8_ = paVar9;
            pVar18.multiplier_ = pVar17.multiplier_;
            bVar15 = false;
          }
          else {
            std::__cxx11::string::string((string *)&local_c0,pcVar2,(allocator *)local_90);
            uVar12 = (long)unit->_M_string_length - local_c0._M_string_length;
            if ((string *)unit->_M_string_length < local_c0._M_string_length || uVar12 == 0) {
              bVar16 = false;
            }
            else {
              iVar6 = std::__cxx11::string::compare
                                ((ulong)unit,uVar12,(string *)local_c0._M_string_length);
              bVar16 = iVar6 == 0;
            }
            paVar9 = &local_c0.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar9) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
              paVar9 = extraout_RAX_00;
            }
            uVar13 = local_98;
            pVar18._8_8_ = paVar9;
            pVar18.multiplier_ = local_d0;
            bVar15 = true;
            if (bVar16) {
              bVar15 = false;
              std::__cxx11::string::_M_replace_aux((ulong)unit,unit->_M_string_length - 2,0,'\x01');
              pVar18 = get_unit(unit,uVar13);
              uVar14 = pVar18._8_8_;
            }
          }
          local_d0 = pVar18.multiplier_;
          pVar17.base_units_ = (unit_data)(int)uVar14;
          pVar17.commodity_ = (int)((ulong)uVar14 >> 0x20);
          pVar17.multiplier_ = local_d0;
          if (!bVar15) break;
          lVar11 = lVar11 + 8;
          local_a0 = CONCAT71(pVar18._9_7_,lVar11 == 0x38);
        } while (lVar11 != 0x38);
        if ((local_a0 & 1) == 0) {
          return pVar17;
        }
      }
    }
  }
  pVar5.base_units_ = (unit_data)0xfa94a488;
  pVar5.commodity_ = 0;
  pVar5.multiplier_ = NAN;
  return pVar5;
}

Assistant:

static precise_unit
    localityModifiers(std::string unit, std::uint64_t match_flags)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 62>
        internationlReplacements{{
            ckpair{"internationaltable", "IT"},
            ckpair{"internationalsteamtable", "IT"},
            ckpair{"international", "i"},
            ckpair{"USandBritish", "av"},
            ckpair{"US&British", "av"},
            ckpair{"USAsurvey", "US"},
            ckpair{"USsurvey", "US"},
            ckpair{"USSurvey", "US"},
            ckpair{"USdry", "US"},
            ckpair{"USA", "US"},
            ckpair{"USstatute", "US"},
            ckpair{"statutory", "US"},
            ckpair{"statute", "US"},
            ckpair{"US", "US"},
            ckpair{"shipping", "ship"},
            ckpair{"gregorian", "g"},
            ckpair{"Gregorian", "g"},
            ckpair{"synodic", "s"},
            ckpair{"sidereal", "sdr"},
            ckpair{"julian", "j"},
            ckpair{"Julian", "j"},
            ckpair{"thermochemical", "th"},
            ckpair{"hydraulic", "mech"},
            ckpair{"Th", "th"},
            ckpair{"(th)", "th"},
            ckpair{"metric", "m"},
            ckpair{"mean", "m"},
            ckpair{"imperial", "br"},
            ckpair{"Imperial", "br"},
            ckpair{"English", "br"},
            ckpair{"imp", "br"},
            ckpair{"wine", "wine"},
            ckpair{"beer", "wine"},
            ckpair{"(IT)", "IT"},
            ckpair{"troy", "tr"},
            ckpair{"apothecary", "ap"},
            ckpair{"apothecaries", "ap"},
            ckpair{"avoirdupois", "av"},
            ckpair{"Chinese", "cn"},
            ckpair{"chinese", "cn"},
            ckpair{"Canadian", "ca"},
            ckpair{"canadian", "ca"},
            ckpair{"survey", "US"},
            ckpair{"tropical", "t"},
            ckpair{"British", "br"},
            ckpair{"british", "br"},
            ckpair{"Br", "br"},
            ckpair{"BR", "br"},
            ckpair{"UK", "br"},
            ckpair{"conventional", "90"},
            ckpair{"AC", "ac"},
            ckpair{"DC", "dc"},
            ckpair{"fluid", "FL"},
            ckpair{"liquid", "FL"},
            ckpair{"fl", "FL"},
            ckpair{"15degC", "[15]"},
            ckpair{"20degC", "[20]"},
            ckpair{"59degF", "[59]"},
            ckpair{"60degF", "[60]"},
            ckpair{"39degF", "[39]"},
            ckpair{"0degC", "[00]"},
            // this should be last

            ckpair{"us", "US"},
        }};
    if (unit.size() < 3) {
        return precise::invalid;
    }
    if (unit.front() == 'u' && (unit[1] == 'S' || unit[1] == 'K')) {
        unit.front() = 'U';
    }
    bool changed = false;
    for (const auto& irep : internationlReplacements) {
        if (strlen(irep.first) == 2) {
            if (strncmp(irep.first, irep.second, 2) == 0) {
                if (ends_with(unit, std::string(1, '_') + irep.second)) {
                    continue;
                }
            }
            if (unit[1] > 0 && (std::isupper(unit[1]) != 0) &&
                (std::toupper(unit[0]) == irep.first[0]) &&
                (unit[1] == irep.first[1])) {
                unit[0] = std::toupper(unit[0]);
            }
        }
        auto fnd = unit.find(irep.first);
        if (fnd != std::string::npos) {
            auto len = strlen(irep.first);
            if (len == unit.size()) {  // this is a modifier if we are checking
                                       // the entire unit this is automatically
                                       // false
                return precise::invalid;
            }
            unit.erase(fnd, len);
            if (fnd > 0 && unit[fnd - 1] == '_') {
                unit.erase(fnd - 1, 1);
            }
            if (fnd < unit.size() && unit[fnd] == '_') {
                unit.erase(fnd, 1);
            }
            unit.push_back('_');
            unit.append(irep.second);
            changed = true;
            break;
        }
    }
    changed |= clearEmptySegments(unit);
    if (changed) {
        auto retunit = unit_from_string_internal(
            unit, match_flags | no_locality_modifiers | no_of_operator);
        if (is_error(retunit) && ((match_flags & no_locality_modifiers) == 0)) {
            return localityModifiers(unit, match_flags | no_locality_modifiers);
        }
        return retunit;
    }
    if (unit.size() < 4) {
        return precise::invalid;
    }
    static constexpr std::array<const char*, 7> rotSequences{
        {"br", "av", "ch", "IT", "th", "ap", "tr"}};
    for (const auto& seq : rotSequences) {
        if (unit.compare(0, 2, seq) == 0) {
            auto nunit = unit.substr((unit[3] == '_') ? 3 : 2);
            if (nunit.back() == 's') {
                nunit.pop_back();
            }
            nunit.push_back('_');
            nunit.append(seq);
            return get_unit(nunit, match_flags);
        }
        if (ends_with(unit, seq)) {
            unit.insert(unit.end() - 2, '_');
            return get_unit(unit, match_flags);
        }
    }

    return precise::invalid;
}